

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseTriangleCase::iterate(BaseTriangleCase *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  RenderTarget *pRVar6;
  char *description;
  IterateResult IVar7;
  ScopedLogSection section;
  string local_c8;
  string local_a8;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  RasterizationArguments local_48;
  string iterationDescription;
  
  local_48.numSamples = this->m_iteration + 1;
  de::toString<int>(&local_c8,&local_48.numSamples);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drawBuffer,
                 "Test iteration ",&local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drawBuffer,
                 " / ");
  de::toString<int>(&local_a8,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 &local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  std::__cxx11::string::~string((string *)&local_c8);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_log,&iterationDescription,&iterationDescription);
  iVar5 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar5,iVar5);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.field_2._M_allocated_capacity = 0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)(uint)this->m_iteration);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,this->m_primitiveDrawType);
  local_a8.field_2._M_allocated_capacity = 0;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_48.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_48.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar6 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_48.redBits = (pRVar6->m_pixelFormat).redBits;
  pRVar6 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_48.greenBits = (pRVar6->m_pixelFormat).greenBits;
  pRVar6 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  uVar3 = local_a8.field_2._M_allocated_capacity;
  sVar2 = local_a8._M_string_length;
  _Var1._M_p = local_a8._M_dataplus._M_p;
  local_48.blueBits = (pRVar6->m_pixelFormat).blueBits;
  local_a8.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
  local_a8._M_dataplus._M_p = local_c8._M_dataplus._M_p;
  local_a8._M_string_length = local_c8._M_string_length;
  local_c8._M_dataplus._M_p = _Var1._M_p;
  local_c8._M_string_length = sVar2;
  local_c8.field_2._M_allocated_capacity = uVar3;
  bVar4 = tcu::verifyTriangleGroupRasterization
                    (&resultImage,(TriangleSceneSpec *)&local_a8,&local_48,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,VERIFICATIONMODE_STRICT);
  if (!bVar4) {
    this->m_allIterationsPassed = false;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_a8);
  iVar5 = this->m_iteration + 1;
  this->m_iteration = iVar5;
  if (iVar5 == this->m_iterationCount) {
    description = "Incorrect rasterization";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar7 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  else {
    IVar7 = CONTINUE;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_c8);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return IVar7;
}

Assistant:

BaseTriangleCase::IterateResult BaseTriangleCase::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	generateTriangles(m_iteration, drawBuffer, triangles);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		compareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}